

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O0

void stun_attr_varsize_add
               (stun_msg_hdr *msg_hdr,uint16_t type,void *buf,size_t buf_size,uint8_t pad)

{
  stun_attr_varsize *attr_00;
  stun_attr_varsize *attr;
  uint8_t pad_local;
  size_t buf_size_local;
  void *buf_local;
  uint16_t type_local;
  stun_msg_hdr *msg_hdr_local;
  
  attr_00 = (stun_attr_varsize *)stun_msg_end(msg_hdr);
  stun_attr_varsize_init(attr_00,type,buf,buf_size,pad);
  stun_msg_add_attr(msg_hdr,(stun_attr_hdr *)attr_00);
  return;
}

Assistant:

void stun_attr_varsize_add(stun_msg_hdr *msg_hdr, uint16_t type,
                           const void *buf, size_t buf_size, uint8_t pad) {
  stun_attr_varsize *attr =
      (stun_attr_varsize *)stun_msg_end(msg_hdr);
  stun_attr_varsize_init(attr, type, buf, buf_size, pad);
  stun_msg_add_attr(msg_hdr, &attr->hdr);
}